

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::SetPermissions(string *file,mode_t mode,bool honor_umask)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  bool bVar3;
  
  bVar3 = false;
  bVar1 = TestFileAccess(file,0);
  if (bVar1) {
    if (honor_umask) {
      __mask = umask(0);
      umask(__mask);
      mode = mode & ~__mask;
    }
    iVar2 = chmod((file->_M_dataplus)._M_p,mode);
    bVar3 = -1 < iVar2;
  }
  return bVar3;
}

Assistant:

bool SystemTools::SetPermissions(const std::string& file,
                                 mode_t mode,
                                 bool honor_umask)
{
  // TEMPORARY / TODO:  After FileExists calls lstat() instead of
  // access(), change this call to FileExists instead of
  // TestFileAccess so that we don't follow symlinks.
  if ( !SystemTools::TestFileAccess(file, TEST_FILE_OK) )
    {
    return false;
    }
  if (honor_umask)
    {
    mode_t currentMask = umask(0);
    umask(currentMask);
    mode &= ~currentMask;
    }
#ifdef _WIN32
  if ( _wchmod(SystemTools::ConvertToWindowsExtendedPath(file).c_str(),
               mode) < 0 )
#else
  if ( chmod(file.c_str(), mode) < 0 )
#endif
    {
    return false;
    }

  return true;
}